

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O0

char * __thiscall
htmlcxx2::HTML::ParserSax::skipComment<char_const*>(ParserSax *this,char *pos,char *end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  char *pcVar5;
  bool bVar6;
  char *d;
  char *end_local;
  char *pos_local;
  ParserSax *this_local;
  
  end_local = pos;
  while( true ) {
    do {
      if (end_local == end) {
        return end_local;
      }
      pcVar3 = end_local + 1;
      cVar1 = *end_local;
      end_local = pcVar3;
    } while (((cVar1 != '-') || (pcVar3 == end)) || (pbVar4 = (byte *)pcVar3, *pcVar3 != '-'));
    do {
      end_local = (char *)pbVar4;
      pbVar4 = (byte *)(end_local + 1);
      bVar6 = false;
      if (pbVar4 != (byte *)end) {
        iVar2 = isspace((uint)*pbVar4);
        bVar6 = iVar2 != 0;
      }
    } while (bVar6);
    if (pbVar4 == (byte *)end) break;
    pcVar5 = end_local + 2;
    end_local = pcVar3;
    if (*pbVar4 == 0x3e) {
      return pcVar5;
    }
  }
  return (char *)pbVar4;
}

Assistant:

It ParserSax::skipComment(It pos, It end)
{
    while (pos != end)
    {
        if (*pos++ == '-' && pos != end && *pos == '-')
        {
            It d(pos);
            while (++pos != end && ::isspace((unsigned char)*pos))
                ;
            if (pos == end || *pos++ == '>')
                break;
            pos = d;
        }
    }
    return pos;
}